

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_buffer.cc
# Opt level: O0

size_t __thiscall raptor::SliceBuffer::CopyToBuffer(SliceBuffer *this,void *buffer,size_t length)

{
  bool bVar1;
  size_t sVar2;
  pointer pSVar3;
  size_t sVar4;
  void *__dest;
  uint8_t *__src;
  size_t local_70;
  size_t len;
  size_t local_38;
  size_t pos;
  size_t left;
  iterator it;
  size_t length_local;
  void *buffer_local;
  SliceBuffer *this_local;
  
  it._M_current = (Slice *)length;
  sVar2 = GetBufferLength(this);
  if (length <= sVar2) {
    left = (size_t)std::vector<raptor::Slice,_std::allocator<raptor::Slice>_>::begin(&this->_vs);
    pos = (size_t)it._M_current;
    local_38 = 0;
    while( true ) {
      len = (size_t)std::vector<raptor::Slice,_std::allocator<raptor::Slice>_>::end(&this->_vs);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<raptor::Slice_*,_std::vector<raptor::Slice,_std::allocator<raptor::Slice>_>_>
                          *)&left,(__normal_iterator<raptor::Slice_*,_std::vector<raptor::Slice,_std::allocator<raptor::Slice>_>_>
                                   *)&len);
      sVar2 = pos;
      if (!bVar1 || pos == 0) break;
      pSVar3 = __gnu_cxx::
               __normal_iterator<raptor::Slice_*,_std::vector<raptor::Slice,_std::allocator<raptor::Slice>_>_>
               ::operator->((__normal_iterator<raptor::Slice_*,_std::vector<raptor::Slice,_std::allocator<raptor::Slice>_>_>
                             *)&left);
      sVar4 = Slice::size(pSVar3);
      if (sVar2 < sVar4) {
        local_70 = pos;
      }
      else {
        pSVar3 = __gnu_cxx::
                 __normal_iterator<raptor::Slice_*,_std::vector<raptor::Slice,_std::allocator<raptor::Slice>_>_>
                 ::operator->((__normal_iterator<raptor::Slice_*,_std::vector<raptor::Slice,_std::allocator<raptor::Slice>_>_>
                               *)&left);
        local_70 = Slice::size(pSVar3);
      }
      __dest = (void *)((long)buffer + local_38);
      pSVar3 = __gnu_cxx::
               __normal_iterator<raptor::Slice_*,_std::vector<raptor::Slice,_std::allocator<raptor::Slice>_>_>
               ::operator->((__normal_iterator<raptor::Slice_*,_std::vector<raptor::Slice,_std::allocator<raptor::Slice>_>_>
                             *)&left);
      __src = Slice::begin(pSVar3);
      memcpy(__dest,__src,local_70);
      pos = pos - local_70;
      local_38 = local_70 + local_38;
      __gnu_cxx::
      __normal_iterator<raptor::Slice_*,_std::vector<raptor::Slice,_std::allocator<raptor::Slice>_>_>
      ::operator++((__normal_iterator<raptor::Slice_*,_std::vector<raptor::Slice,_std::allocator<raptor::Slice>_>_>
                    *)&left);
    }
    return local_38;
  }
  LogFormatPrint("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/core/slice/slice_buffer.cc"
                 ,0x6a,kLogLevelError,"assertion failed: %s","length <= GetBufferLength()");
  abort();
}

Assistant:

size_t SliceBuffer::CopyToBuffer(void* buffer, size_t length) {
    RAPTOR_ASSERT(length <= GetBufferLength());

    auto it = _vs.begin();

    size_t left = length;
    size_t pos = 0;

    while(it != _vs.end() && left != 0) {

        size_t len = RAPTOR_MIN(left, it->size());
        memcpy((uint8_t*)buffer + pos, it->begin(), len);

        left -= len;
        pos += len;

        ++it;
    }

    return pos;
}